

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectBase.hpp
# Opt level: O0

void __thiscall
Diligent::
DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
::DeviceObjectBase(DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                   *this,IReferenceCounters *pRefCounters,RenderDeviceVkImpl *pDevice,
                  PipelineStateDesc *ObjDesc,bool bIsDeviceInternal)

{
  int iVar1;
  Char *Message;
  size_t sVar2;
  IMemoryAllocator *pIVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char (*Args_1) [21];
  uint local_98;
  char *AddressStr;
  size_t size_1;
  char *NameCopy;
  size_t size;
  string msg;
  bool bIsDeviceInternal_local;
  PipelineStateDesc *ObjDesc_local;
  RenderDeviceVkImpl *pDevice_local;
  IReferenceCounters *pRefCounters_local;
  DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
  *this_local;
  
  ObjectBase<Diligent::IPipelineStateVk>::ObjectBase
            (&this->super_ObjectBase<Diligent::IPipelineStateVk>,pRefCounters);
  (this->super_ObjectBase<Diligent::IPipelineStateVk>).
  super_RefCountedObject<Diligent::IPipelineStateVk>.super_IPipelineStateVk.super_IPipelineState.
  super_IDeviceObject.super_IObject._vptr_IObject = (_func_int **)&PTR_QueryInterface_0139b580;
  this->m_pDevice = pDevice;
  memcpy(&this->m_Desc,ObjDesc,0x40);
  if (pDevice == (RenderDeviceVkImpl *)0x0) {
    local_98 = 0;
  }
  else {
    local_98 = RenderDeviceBase<Diligent::EngineVkImplTraits>::GenerateUniqueId
                         ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)pDevice);
  }
  Args_1 = (char (*) [21])(ulong)local_98;
  this->m_UniqueID = local_98;
  this->m_bIsDeviceInternal = bIsDeviceInternal;
  RefCntAutoPtr<Diligent::IObject>::RefCntAutoPtr(&this->m_pUserData);
  if ((this->m_bIsDeviceInternal & 1U) == 0) {
    if (this->m_pDevice == (RenderDeviceVkImpl *)0x0) {
      FormatString<char[26],char[21]>
                ((string *)&size,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_pDevice != nullptr",Args_1);
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"DeviceObjectBase",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
                 ,0x47);
      std::__cxx11::string::~string((string *)&size);
    }
    RefCountedObject<Diligent::IRenderDeviceVk>::AddRef
              ((RefCountedObject<Diligent::IRenderDeviceVk> *)this->m_pDevice);
  }
  if ((ObjDesc->super_DeviceObjectAttribs).Name == (Char *)0x0) {
    pIVar3 = GetStringAllocator();
    iVar1 = (**pIVar3->_vptr_IMemoryAllocator)
                      (pIVar3,0x13,"Object address string",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
                       ,0x55);
    snprintf((char *)CONCAT44(extraout_var_00,iVar1),0x13,"0x%llX",this);
    (this->m_Desc).super_DeviceObjectAttribs.Name = (char *)CONCAT44(extraout_var_00,iVar1);
  }
  else {
    sVar2 = strlen((ObjDesc->super_DeviceObjectAttribs).Name);
    pIVar3 = GetStringAllocator();
    iVar1 = (**pIVar3->_vptr_IMemoryAllocator)
                      (pIVar3,sVar2 + 1,"Object name copy",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
                       ,0x4e);
    memcpy((Char *)CONCAT44(extraout_var,iVar1),(ObjDesc->super_DeviceObjectAttribs).Name,sVar2 + 1)
    ;
    (this->m_Desc).super_DeviceObjectAttribs.Name = (Char *)CONCAT44(extraout_var,iVar1);
  }
  return;
}

Assistant:

DeviceObjectBase(IReferenceCounters*   pRefCounters,
                     RenderDeviceImplType* pDevice,
                     const ObjectDescType& ObjDesc,
                     bool                  bIsDeviceInternal = false) :
        // clang-format off
        TBase              {pRefCounters},
        m_pDevice          {pDevice          },
        m_Desc             {ObjDesc          },
        m_UniqueID         {pDevice != nullptr ? pDevice->GenerateUniqueId() : 0},
        m_bIsDeviceInternal{bIsDeviceInternal}
    //clang-format on
    {
        // Do not keep strong reference to the device if the object is an internal device object
        if (!m_bIsDeviceInternal)
        {
            // Device can be null if object is used for serialization
            VERIFY_EXPR(m_pDevice != nullptr);
            m_pDevice->AddRef();
        }

        if (ObjDesc.Name != nullptr)
        {
            size_t  size     = strlen(ObjDesc.Name) + 1;
            char* NameCopy = ALLOCATE(GetStringAllocator(), "Object name copy", char, size);
            memcpy(NameCopy, ObjDesc.Name, size);
            m_Desc.Name = NameCopy;
        }
        else
        {
            size_t size       = 16 + 2 + 1; // 0x12345678
            char*  AddressStr = ALLOCATE(GetStringAllocator(), "Object address string", char, size);
            snprintf(AddressStr, size, "0x%llX", static_cast<unsigned long long>(reinterpret_cast<size_t>(this)));
            m_Desc.Name = AddressStr;
        }

        //                        !!!WARNING!!!
        // We cannot add resource to the hash table from here, because the object
        // has not been completely created yet and the reference counters object
        // is not initialized!
        //m_pDevice->AddResourceToHash( this ); - ERROR!
    }